

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_test.cxx
# Opt level: O2

ReturnCode
failure_test::ool_detect_cb(atomic<bool> *invoked,size_t purge_upto,Type type,Param *params)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ostream *poVar3;
  hash<std::thread::id> local_49;
  id local_48;
  string local_40 [32];
  
  if (type == OutOfLogRangeWarning) {
    if (purge_upto + 1 == *params->ctx) {
      LOCK();
      (invoked->_M_base)._M_i = true;
      UNLOCK();
    }
    else {
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar3 = std::operator<<(poVar3,"        time: ");
      poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_40);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"      thread: ");
      poVar3 = std::operator<<(poVar3,"\x1b[33m");
      pp_Var1 = poVar3->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar3->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar3->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar3->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar3 = std::operator<<(poVar3,0x30);
      local_48._M_thread = pthread_self();
      std::hash<std::thread::id>::operator()(&local_49,&local_48);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"          in: ");
      poVar3 = std::operator<<(poVar3,"\x1b[36m");
      poVar3 = std::operator<<(poVar3,"operator()");
      poVar3 = std::operator<<(poVar3,"()\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"          at: ");
      poVar3 = std::operator<<(poVar3,"\x1b[32m");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/failure_test.cxx"
                              );
      poVar3 = std::operator<<(poVar3,"\x1b[0m:");
      poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x106);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"    value of: \x1b[1;34mool_args->startIdxOfLeader\x1b[0m\n")
      ;
      poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
      poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\x1b[0m\n");
      std::__cxx11::string::~string(local_40);
      TestSuite::failHandler();
    }
  }
  else {
    cb_default(type,params);
  }
  return Ok;
}

Assistant:

cb_func::ReturnCode ool_detect_cb(std::atomic<bool>* invoked,
                                  size_t purge_upto,
                                  cb_func::Type type,
                                  cb_func::Param* params)
{
    if (type == cb_func::Type::OutOfLogRangeWarning) {
        cb_func::OutOfLogRangeWarningArgs* ool_args =
            (cb_func::OutOfLogRangeWarningArgs*)params->ctx;
        auto chk_func = [purge_upto, ool_args]() -> int {
            CHK_EQ(purge_upto + 1, ool_args->startIdxOfLeader);
            return 0;
        };
        if (chk_func() == 0) {
            invoked->store(true);
        }
    } else {
        return cb_default(type, params);
    }

    return cb_func::ReturnCode::Ok;
}